

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O1

QWidgetList * __thiscall
QAbstractScrollAreaScrollBarContainer::widgets
          (QWidgetList *__return_storage_ptr__,QAbstractScrollAreaScrollBarContainer *this,
          LogicalPosition position)

{
  int iVar1;
  long *plVar2;
  int i;
  int iVar3;
  long in_FS_OFFSET;
  QWidget *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QWidget **)0x0;
  (__return_storage_ptr__->d).size = 0;
  iVar1 = scrollBarLayoutIndex(this);
  if (position == LogicalRight) {
    iVar3 = (**(code **)(*(long *)&this->layout->super_QLayout + 200))();
    iVar1 = iVar1 + 1;
    QList<QWidget_*>::reserve(__return_storage_ptr__,(long)(iVar3 - iVar1));
    if (iVar1 < iVar3) {
      do {
        plVar2 = (long *)(**(code **)(*(long *)&this->layout->super_QLayout + 0xa8))
                                   (this->layout,iVar1);
        local_38 = (QWidget *)(**(code **)(*plVar2 + 0x68))(plVar2);
        QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                  ((QPodArrayOps<QWidget*> *)__return_storage_ptr__,(__return_storage_ptr__->d).size
                   ,&local_38);
        QList<QWidget_*>::end(__return_storage_ptr__);
        iVar1 = iVar1 + 1;
      } while (iVar3 != iVar1);
    }
  }
  else if ((position == LogicalLeft) &&
          (QList<QWidget_*>::reserve(__return_storage_ptr__,(long)iVar1), 0 < iVar1)) {
    iVar3 = 0;
    do {
      plVar2 = (long *)(**(code **)(*(long *)&this->layout->super_QLayout + 0xa8))
                                 (this->layout,iVar3);
      local_38 = (QWidget *)(**(code **)(*plVar2 + 0x68))(plVar2);
      QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                ((QPodArrayOps<QWidget*> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                 &local_38);
      QList<QWidget_*>::end(__return_storage_ptr__);
      iVar3 = iVar3 + 1;
    } while (iVar1 != iVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QWidgetList QAbstractScrollAreaScrollBarContainer::widgets(LogicalPosition position)
{
    QWidgetList list;
    const int scrollBarIndex = scrollBarLayoutIndex();
    if (position == LogicalLeft) {
        list.reserve(scrollBarIndex);
        for (int i = 0; i < scrollBarIndex; ++i)
            list.append(layout->itemAt(i)->widget());
    } else if (position == LogicalRight) {
        const int layoutItemCount = layout->count();
        list.reserve(layoutItemCount - (scrollBarIndex + 1));
        for (int i = scrollBarIndex + 1; i < layoutItemCount; ++i)
            list.append(layout->itemAt(i)->widget());
    }
    return list;
}